

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

uint JsUtil::
     BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
     ::GetBucket(hash_t hashCode,int bucketCount,int modFunctionIndex)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint uVar4;
  
  if ((bucketCount < 2) || ((bucketCount + 0x7fffffffU & bucketCount) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SizePolicy.h"
                       ,0x22,"(Math::IsPow2(size) && size > 1)","Size is not a power of 2.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  uVar4 = hashCode >> 0x10 ^ hashCode >> 1;
  return bucketCount - 1U & (uVar4 >> 7 ^ uVar4);
}

Assistant:

static uint GetBucket(hash_t hashCode, int bucketCount, int modFunctionIndex)
        {
            return SizePolicy::GetBucket(UNTAGHASH(hashCode), bucketCount, modFunctionIndex);
        }